

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myHashMap.h
# Opt level: O0

wallet * __thiscall myHashMap<wallet>::getData(myHashMap<wallet> *this,myString *key)

{
  myBucket_chain<wallet> *pmVar1;
  wallet *pwVar2;
  long lVar3;
  myString local_38;
  uint local_1c;
  myString *pmStack_18;
  int indexHash;
  myString *key_local;
  myHashMap<wallet> *this_local;
  
  pmStack_18 = key;
  key_local = (myString *)this;
  local_1c = (*this->hashFunc)(key,this->tableSize);
  pmVar1 = this->table;
  lVar3 = (long)(int)local_1c;
  myString::myString(&local_38,key);
  pwVar2 = myBucket_chain<wallet>::getData(pmVar1 + lVar3,&local_38);
  myString::~myString(&local_38);
  return pwVar2;
}

Assistant:

T* getData(myString key) {
        int indexHash = hashFunc(key,this->tableSize);

        return this->table[indexHash].getData(key);

    }